

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

Am_Drawonable *
Am_Drawonable_Impl::Create_Drawonable_From_XWindow
          (Window created_drawable,Display *created_display,
          Am_External_Event_Handler *ext_ev_handler,char *tit,char *icon_tit,bool vis,
          bool initially_iconified,Am_Style back_color,bool save_under_flag,int min_w,int min_h,
          int max_w,int max_h,bool title_bar_flag,bool query_user_for_position,
          bool query_user_for_size,bool clip_by_children_flag,Am_Input_Event_Handlers *evh)

{
  Screen_Info **ppSVar1;
  Screen_Desc *the_screen;
  Display *pDVar2;
  Window WVar3;
  char *icon_name;
  int iVar4;
  Am_Drawonable *d;
  ostream *poVar5;
  Am_Drawonable_Impl *this;
  Screen_Info *pSVar6;
  Am_Style local_120;
  uint h;
  uint w;
  int t;
  int l;
  char *local_108;
  Am_Style local_100;
  Display *local_f8;
  Window local_f0;
  Am_External_Event_Handler *local_e8;
  char *local_e0;
  unsigned_long attrib_value_mask;
  Window p;
  uint bit_depth;
  uint border_w;
  uint nc;
  Window dummy_root;
  Window *c;
  Window r;
  XSetWindowAttributes attrib;
  
  local_e8 = ext_ev_handler;
  XQueryTree(created_display,created_drawable,&r,&p,&c,&nc);
  if (c != (Window *)0x0) {
    XFree();
  }
  iVar4 = XFindContext(created_display,p,Backpointer,&attrib);
  d = (Am_Drawonable *)attrib.background_pixmap;
  if (iVar4 != 0) {
    d = (Am_Drawonable *)0x0;
  }
  if (d == (Am_Drawonable *)0x0) {
    d = (Am_Drawonable *)0x0;
    pSVar6 = Scrn_Mgr.head;
    if (Scrn_Mgr.head != (Screen_Info *)0x0) {
      do {
        if (pSVar6->dpy == created_display) {
          d = pSVar6->draw;
          break;
        }
        ppSVar1 = &pSVar6->next;
        pSVar6 = *ppSVar1;
      } while (*ppSVar1 != Scrn_Mgr.head);
    }
    if (d == (Am_Drawonable *)0x0) {
      d = make_root_drawonable((char *)0x0,created_display);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Warning, Can\'t find parent for display ",0x2a);
      poVar5 = std::ostream::_M_insert<void_const*>(&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," so created new one ",0x14);
      poVar5 = ::operator<<(poVar5,d);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::ostream::flush();
    }
  }
  local_108 = tit;
  local_f8 = created_display;
  local_f0 = created_drawable;
  local_e0 = icon_tit;
  iVar4 = XGetGeometry(created_display,created_drawable,&dummy_root,&l,&t,&w,&h,&border_w,&bit_depth
                      );
  if (iVar4 == 0) {
    Am_Error("** Can\'t get window geometry.\n");
  }
  this = (Am_Drawonable_Impl *)operator_new(0xa8);
  Am_Style::Am_Style(&local_120,(Am_Style *)back_color.data);
  icon_name = local_e0;
  Am_Drawonable_Impl(this,l,t,w,h,local_108,local_e0,vis,initially_iconified,&local_120,
                     save_under_flag,min_w,min_h,max_w,max_h,title_bar_flag,clip_by_children_flag,
                     *(uint *)(*(long *)&d[1].left + 0x38),evh);
  Am_Style::~Am_Style(&local_120);
  this->owner = d;
  this->screen = *(Screen_Desc **)&d[1].left;
  this->ext_handler = local_e8;
  **(int **)&d[1].left = **(int **)&d[1].left + 1;
  Initialize_Event_Mask(this);
  the_screen = this->screen;
  Am_Style::Am_Style(&local_100,(Am_Style *)back_color.data);
  install_attributes(&attrib,&attrib_value_mask,this,the_screen,&local_100,save_under_flag,
                     title_bar_flag,this->current_event_mask);
  Am_Style::~Am_Style(&local_100);
  WVar3 = local_f0;
  pDVar2 = local_f8;
  this->xlib_drawable = local_f0;
  XChangeWindowAttributes(local_f8,local_f0,attrib_value_mask,&attrib);
  XSaveContext(pDVar2,WVar3,Backpointer,this);
  set_other_window_properties
            (this->xlib_drawable,this->screen->display,local_108,icon_name,initially_iconified,min_w
             ,min_h,max_w,max_h,query_user_for_position,query_user_for_size);
  return &this->super_Am_Drawonable;
}

Assistant:

Am_Drawonable *
Am_Drawonable_Impl::Create_Drawonable_From_XWindow(
    Window created_drawable, Display *created_display,
    Am_External_Event_Handler *ext_ev_handler, const char *tit,
    const char *icon_tit, bool vis, bool initially_iconified,
    Am_Style back_color, bool save_under_flag, int min_w, int min_h, int max_w,
    int max_h, bool title_bar_flag, bool query_user_for_position,
    bool query_user_for_size, bool clip_by_children_flag,
    Am_Input_Event_Handlers *evh)
{

  Window p, r;
  Window *c;
  unsigned int nc;
  XQueryTree(created_display, created_drawable, &r, &p, &c, &nc);
  if (c)
    XFree(c);

  Am_Drawonable_Impl *parent = Get_Drawable_Backpointer(created_display, p);
  if (!parent) {
    parent = (Am_Drawonable_Impl *)Scrn_Mgr.Member(created_display);
    if (!parent) {
      parent =
          (Am_Drawonable_Impl *)make_root_drawonable(nullptr, created_display);
      std::cerr << "** Warning, Can't find parent for display "
                << created_display << " so created new one " << parent
                << std::endl
                << std::flush;
    }
  }

  Window dummy_root;
  int l, t;
  unsigned int w, h;
  unsigned int border_w;
  unsigned int bit_depth;
  if (!XGetGeometry(created_display, created_drawable, &dummy_root, &l, &t, &w,
                    &h, &border_w, &bit_depth))
    Am_Error("** Can't get window geometry.\n");

  Am_Drawonable_Impl *d = new /* Am_External_Drawonable_Impl */
      Am_Drawonable_Impl(l, t, w, h, tit, icon_tit, vis, initially_iconified,
                         back_color, save_under_flag, min_w, min_h, max_w,
                         max_h, title_bar_flag, clip_by_children_flag,
                         parent->screen->depth, evh);

  d->owner = parent;
  d->screen = parent->screen;
  d->ext_handler = ext_ev_handler;

  parent->screen->Note_Reference();

  // initialize for event handling
  d->Initialize_Event_Mask(); // must come before call to generate_attrib

  // Create window attribute struct and value-mask for attribute fields
  //
  XSetWindowAttributes attrib;
  unsigned long attrib_value_mask;
  install_attributes(&attrib, &attrib_value_mask, d, d->screen, back_color,
                     save_under_flag, title_bar_flag, d->current_event_mask);

  d->xlib_drawable = created_drawable;

  XChangeWindowAttributes(created_display, created_drawable, attrib_value_mask,
                          &attrib);
  Set_Drawable_Backpointer(created_display, created_drawable, d);

  set_other_window_properties(
      d->xlib_drawable, d->screen->display, tit, icon_tit, initially_iconified,
      min_w, min_h, max_w, max_h, query_user_for_position, query_user_for_size);
  return d;
}